

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int net_seqnum_diff(unsigned_long seq1,unsigned_long seq2,unsigned_long maxseq)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = seq2 - seq1;
  if (seq2 < seq1) {
    if ((ulong)(long)(int)(uVar1 + maxseq) < maxseq >> 1) {
      uVar1 = uVar1 + maxseq;
    }
    return (int)uVar1;
  }
  iVar2 = 0;
  if (maxseq >> 1 <= uVar1) {
    iVar2 = (int)maxseq;
  }
  return (int)uVar1 - iVar2;
}

Assistant:

int net_seqnum_diff(unsigned long seq1, unsigned long seq2,
                    unsigned long maxseq) {
  if (seq2 >= seq1) {
    if ((seq2 - seq1) < (maxseq / 2))
      return seq2 - seq1;
    else
      return (seq2 - seq1) - maxseq;
  } else {
    int d = seq2 + maxseq - seq1;
    if (d < (maxseq / 2))
      return d;
    else
      return d - maxseq;
  }
}